

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O0

upb_test_FakeMessageSet_Item_UnknownGroup *
upb_test_FakeMessageSet_Item_mutable_unknowngroup
          (upb_test_FakeMessageSet_Item *msg,upb_Arena *arena)

{
  upb_test_FakeMessageSet_Item_UnknownGroup *local_20;
  upb_test_FakeMessageSet_Item_UnknownGroup *sub;
  upb_Arena *arena_local;
  upb_test_FakeMessageSet_Item *msg_local;
  
  local_20 = upb_test_FakeMessageSet_Item_unknowngroup(msg);
  if ((local_20 == (upb_test_FakeMessageSet_Item_UnknownGroup *)0x0) &&
     (local_20 = (upb_test_FakeMessageSet_Item_UnknownGroup *)
                 _upb_Message_New(&upb_0test__FakeMessageSet__Item__UnknownGroup_msg_init,arena),
     local_20 != (upb_test_FakeMessageSet_Item_UnknownGroup *)0x0)) {
    upb_test_FakeMessageSet_Item_set_unknowngroup(msg,local_20);
  }
  return local_20;
}

Assistant:

UPB_INLINE struct upb_test_FakeMessageSet_Item_UnknownGroup* upb_test_FakeMessageSet_Item_mutable_unknowngroup(upb_test_FakeMessageSet_Item* msg, upb_Arena* arena) {
  struct upb_test_FakeMessageSet_Item_UnknownGroup* sub = (struct upb_test_FakeMessageSet_Item_UnknownGroup*)upb_test_FakeMessageSet_Item_unknowngroup(msg);
  if (sub == NULL) {
    sub = (struct upb_test_FakeMessageSet_Item_UnknownGroup*)_upb_Message_New(&upb_0test__FakeMessageSet__Item__UnknownGroup_msg_init, arena);
    if (sub) upb_test_FakeMessageSet_Item_set_unknowngroup(msg, sub);
  }
  return sub;
}